

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O0

void __thiscall
Deque<int,_std::allocator<int>_>::push_back(Deque<int,_std::allocator<int>_> *this,value_type *val)

{
  bool bVar1;
  DataBlock **ppDVar2;
  int *piVar3;
  DataBlock *this_00;
  int *in_RSI;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *in_RDI;
  DataBlock *block;
  pointer ptr;
  DataBlock **in_stack_ffffffffffffffa8;
  Deque<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *this_01;
  uint in_stack_ffffffffffffffb8;
  undefined1 fillFromEnd;
  new_allocator<int> *in_stack_ffffffffffffffc0;
  
  bVar1 = RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
          ::empty(in_RDI);
  if (!bVar1) {
    ppDVar2 = RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
              ::back(in_RDI);
    bVar1 = DataBlock::can_push_back(*ppDVar2);
    if (bVar1) goto LAB_0015e879;
  }
  bVar1 = RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
          ::full(in_RDI);
  if (bVar1) {
    level_up(in_stack_ffffffffffffffb0);
  }
  fillFromEnd = 0;
  piVar3 = __gnu_cxx::new_allocator<int>::allocate
                     (in_stack_ffffffffffffffc0,(ulong)in_stack_ffffffffffffffb8,
                      in_stack_ffffffffffffffb0);
  this_00 = (DataBlock *)operator_new(0x18);
  DataBlock::DataBlock(this_00,piVar3,(bool)fillFromEnd);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::push_back(&in_stack_ffffffffffffffb0->current_,in_stack_ffffffffffffffa8);
  bVar1 = RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
          ::full(in_RDI + 1);
  if (!bVar1) {
    RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    ::push_back(&in_stack_ffffffffffffffb0->current_,in_stack_ffffffffffffffa8);
  }
LAB_0015e879:
  overtake(in_stack_ffffffffffffffb0);
  this_01 = in_RDI + 3;
  ppDVar2 = RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
            ::back(in_RDI);
  piVar3 = (*ppDVar2)->end;
  (*ppDVar2)->end = piVar3 + 1;
  __gnu_cxx::new_allocator<int>::construct<int,int_const&>
            ((new_allocator<int> *)this_01,piVar3,in_RSI);
  return;
}

Assistant:

void push_back(const value_type &val) {
        if (current_.empty() || !current_.back()->can_push_back()) {
            if (current_.full()) {
                level_up();
            }
            pointer ptr = allocator_.allocate(DataBlock::SIZE);
            DataBlock *block = new DataBlock(ptr);
            current_.push_back(block);
            if (!small_.full()) {
                small_.push_back(block);
            }
        }
        overtake();
        allocator_.construct(current_.back()->end++, val);
    }